

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::write_metadata_packet
          (ut_metadata_peer_plugin *this,msg_t type,int piece)

{
  ut_metadata_plugin *puVar1;
  pointer pcVar2;
  element_type *peVar3;
  byte bVar4;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  __visit_result_t<libtorrent::aux::bencode_visitor<char_*>,_const_std::variant<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>_&>
  _Var12;
  entry *peVar13;
  uint val;
  uint uVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  pointer pcVar16;
  int32_t iVar17;
  int size;
  ulong i;
  integer_type i_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> buf;
  span<char> holder;
  entry e;
  char msg [200];
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  local_130;
  bencode_visitor<char_*> local_108;
  char *local_100;
  undefined4 local_f8;
  undefined1 local_f4;
  undefined1 local_f3;
  char local_f2 [202];
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  uVar15 = CONCAT71(in_register_00000031,type) & 0xffffffff;
  i = CONCAT71(in_register_00000031,type) & 0xffffffff;
  aux::peer_connection::peer_log
            (&this->m_pc->super_peer_connection,outgoing_message,"UT_METADATA",
             "type: %d (%s) piece: %d",uVar15,
             _ZZN10libtorrent12_GLOBAL__N_123ut_metadata_peer_plugin21write_metadata_packetENS0_5msg_tEiE5names_rel
             + *(int *)(
                       _ZZN10libtorrent12_GLOBAL__N_123ut_metadata_peer_plugin21write_metadata_packetENS0_5msg_tEiE5names_rel
                       + i * 4),piece);
  if (this->m_message_index != 0) {
    entry::entry((entry *)&local_130);
    key._M_str = "msg_type";
    key._M_len = 8;
    peVar13 = entry::operator[]((entry *)&local_130,key);
    entry::operator=(peVar13,i);
    key_00._M_str = "piece";
    key_00._M_len = 5;
    peVar13 = entry::operator[]((entry *)&local_130,key_00);
    entry::operator=(peVar13,(long)piece);
    if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length) {
      puVar1 = this->m_tp;
      pcVar16 = (puVar1->m_metadata).super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pcVar2 = (puVar1->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (pcVar16 == pcVar2) {
        peVar3 = (puVar1->m_torrent->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3->m_files).m_piece_length < 1) {
          i_00 = 0;
        }
        else {
          i_00 = (integer_type)peVar3->m_info_section_size;
        }
      }
      else {
        i_00 = (long)pcVar2 - (long)pcVar16;
      }
      key_01._M_str = "total_size";
      key_01._M_len = 10;
      peVar13 = entry::operator[]((entry *)&local_130,key_01);
      entry::operator=(peVar13,i_00);
    }
    if ((char)uVar15 == '\x01') {
      puVar1 = this->m_tp;
      pcVar16 = (puVar1->m_metadata).super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pcVar2 = (puVar1->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (pcVar16 == pcVar2) {
        peVar3 = (puVar1->m_torrent->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3->m_files).m_piece_length < 1) {
          pcVar16 = (pointer)0x0;
          iVar17 = 0;
        }
        else {
          pcVar16 = (peVar3->m_info_section).px;
          iVar17 = peVar3->m_info_section_size;
        }
      }
      else {
        iVar17 = (int)pcVar2 - (int)pcVar16;
      }
      pcVar16 = pcVar16 + piece * 0x4000;
      size = iVar17 + piece * -0x4000;
      if (0x3fff < size) {
        size = 0x4000;
      }
    }
    else {
      pcVar16 = (pointer)0x0;
      size = 0;
    }
    local_100 = local_f2;
    local_108.out = &local_100;
    _Var12 = ::std::
             visit<libtorrent::aux::bencode_visitor<char*>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                       (&local_108,&local_130);
    uVar14 = size + _Var12 + 2;
    uVar9 = (ushort)((uVar14 & 0xff00ff) >> 0x10);
    uVar10 = (ushort)(uVar14 >> 8) & 0xff;
    uVar11 = (ushort)(uVar14 & 0xff00ff);
    bVar4 = (byte)(uVar14 >> 0x18);
    uVar8 = (ushort)bVar4;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * bVar4 - (0xff < uVar8);
    bVar5 = ((uVar14 & 0xff0000) != 0) * (uVar9 < 0x100) * (char)(uVar14 >> 0x10) - (0xff < uVar9);
    bVar6 = ((uVar14 & 0xff00) != 0) * (uVar10 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar10);
    bVar7 = ((uVar14 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar14 - (0xff < uVar11);
    local_f8 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                        CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                 CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                          (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))))
    ;
    local_f4 = 0x14;
    local_f3 = (undefined1)this->m_message_index;
    buf.m_len = (long)(_Var12 + 6);
    buf.m_ptr = (char *)&local_f8;
    aux::peer_connection::send_buffer(&this->m_pc->super_peer_connection,buf);
    if (size != 0) {
      holder.m_len = (long)size;
      holder.m_ptr = pcVar16;
      aux::bt_peer_connection::append_const_send_buffer<libtorrent::span<char>>
                (this->m_pc,holder,size);
    }
    counters::inc_stats_counter((this->m_pc->super_peer_connection).m_counters,0x67,1);
    counters::inc_stats_counter((this->m_pc->super_peer_connection).m_counters,0x66,1);
    entry::~entry((entry *)&local_130);
  }
  return;
}

Assistant:

void write_metadata_packet(msg_t const type, int const piece)
		{
			TORRENT_ASSERT(!m_pc.associated_torrent().expired());

#ifndef TORRENT_DISABLE_LOGGING
			static char const* names[] = {"request", "data", "dont-have"};
			char const* n = "";
			if (type >= msg_t::request && type <= msg_t::dont_have) n = names[static_cast<int>(type)];
			m_pc.peer_log(peer_log_alert::outgoing_message, "UT_METADATA"
				, "type: %d (%s) piece: %d", static_cast<int>(type), n, piece);
#endif

			// abort if the peer doesn't support the metadata extension
			if (m_message_index == 0) return;

			entry e;
			e["msg_type"] = static_cast<int>(type);
			e["piece"] = piece;

			char const* metadata = nullptr;
			int metadata_piece_size = 0;

			if (m_torrent.valid_metadata())
				e["total_size"] = m_tp.metadata().size();

			if (type == msg_t::piece)
			{
				TORRENT_ASSERT(piece >= 0 && piece < (m_tp.metadata().size() + 16 * 1024 - 1) / (16 * 1024));
				TORRENT_ASSERT(m_pc.associated_torrent().lock()->valid_metadata());
				TORRENT_ASSERT(m_torrent.valid_metadata());

				int const offset = piece * 16 * 1024;
				metadata = m_tp.metadata().data() + offset;
				metadata_piece_size = std::min(
					int(m_tp.metadata().size()) - offset, 16 * 1024);
				TORRENT_ASSERT(metadata_piece_size > 0);
				TORRENT_ASSERT(offset >= 0);
				TORRENT_ASSERT(offset + metadata_piece_size <= m_tp.metadata().size());
			}

			// TODO: 3 use the aux::write_* functions and the span here instead, it
			// will fit better with send_buffer()
			char msg[200];
			char* header = msg;
			char* p = &msg[6];
			int const len = bencode(p, e);
			int const total_size = 2 + len + metadata_piece_size;
			namespace io = aux;
			io::write_uint32(total_size, header);
			io::write_uint8(aux::bt_peer_connection::msg_extended, header);
			io::write_uint8(m_message_index, header);

			m_pc.send_buffer({msg, len + 6});
			// TODO: we really need to increment the refcounter on the torrent
			// while this buffer is still in the peer's send buffer
			if (metadata_piece_size)
			{
				m_pc.append_const_send_buffer(
					span<char>(const_cast<char*>(metadata), metadata_piece_size), metadata_piece_size);
			}

			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_extended);
			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_metadata);
		}